

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerSpreadArrayLiteral(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  Opnd *src1Opnd;
  Opnd *src2Opnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  LoadScriptContext(this,instr);
  pOVar1 = IR::Instr::UnlinkSrc2(instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar1);
  pOVar1 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar1);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr,HelperSpreadArrayLiteral,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return;
}

Assistant:

void
Lowerer::LowerSpreadArrayLiteral(IR::Instr *instr)
{
    LoadScriptContext(instr);

    IR::Opnd *src2Opnd = instr->UnlinkSrc2();
    m_lowererMD.LoadHelperArgument(instr, src2Opnd);

    IR::Opnd *src1Opnd = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, src1Opnd);

    this->m_lowererMD.ChangeToHelperCall(instr, IR::HelperSpreadArrayLiteral);
}